

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCommand.cpp
# Opt level: O0

bool __thiscall
llbuild::buildsystem::ExternalCommand::isResultValid
          (ExternalCommand *this,BuildSystem *system,BuildValue *value)

{
  undefined8 this_00;
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  reference ppBVar4;
  FileSystem *fileSystem;
  FileInfo *pFVar5;
  undefined1 local_88 [8];
  FileInfo info;
  BuildNode *node;
  uint e;
  uint i;
  BuildValue *value_local;
  BuildSystem *system_local;
  ExternalCommand *this_local;
  
  if ((this->alwaysOutOfDate & 1U) == 0) {
    bVar1 = BuildValue::isSuccessfulCommand(value);
    if (bVar1) {
      node._4_4_ = 0;
      sVar3 = std::
              vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
              ::size(&(this->super_Command).outputs);
      for (; node._4_4_ != (uint)sVar3; node._4_4_ = node._4_4_ + 1) {
        ppBVar4 = std::
                  vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                  ::operator[](&(this->super_Command).outputs,(ulong)node._4_4_);
        info.checksum.bytes._24_8_ = *ppBVar4;
        bVar1 = BuildNode::isVirtual((BuildNode *)info.checksum.bytes._24_8_);
        this_00 = info.checksum.bytes._24_8_;
        if (!bVar1) {
          fileSystem = BuildSystem::getFileSystem(system);
          BuildNode::getFileInfo((FileInfo *)local_88,(BuildNode *)this_00,fileSystem);
          bVar1 = BuildNode::isMutated((BuildNode *)info.checksum.bytes._24_8_);
          if (bVar1) {
            pFVar5 = BuildValue::getNthOutputInfo(value,node._4_4_);
            bVar1 = llbuild::basic::FileInfo::isMissing(pFVar5);
            bVar2 = llbuild::basic::FileInfo::isMissing((FileInfo *)local_88);
            if (bVar1 != bVar2) {
              return false;
            }
          }
          else {
            pFVar5 = BuildValue::getNthOutputInfo(value,node._4_4_);
            bVar1 = llbuild::basic::FileInfo::operator!=(pFVar5,(FileInfo *)local_88);
            if (bVar1) {
              return false;
            }
          }
        }
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ExternalCommand::isResultValid(BuildSystem& system,
                                    const BuildValue& value) {
  // Treat the command as always out-of-date, if requested.
  if (alwaysOutOfDate)
    return false;
      
  // If the prior value wasn't for a successful command, recompute.
  if (!value.isSuccessfulCommand())
    return false;
    
  // Check the timestamps on each of the outputs.
  for (unsigned i = 0, e = outputs.size(); i != e; ++i) {
    auto* node = outputs[i];

    // Ignore virtual outputs.
    if (node->isVirtual())
      continue;

    // Rebuild if the output information has changed.
    //
    // We intentionally allow missing outputs here, as long as they haven't
    // changed. This is under the assumption that the commands themselves are
    // behaving correctly when they exit successfully, and that downstream
    // commands would diagnose required missing inputs.
    //
    // FIXME: CONSISTENCY: One consistency issue in this model currently is that
    // if the output was missing, then appears, nothing will remove it; that
    // results in an inconsistent build. What would be nice if we supported
    // per-edge annotations on whether an output was optional -- in that case we
    // could enforce and error on the missing output if not annotated, and we
    // could enable behavior to remove such output files if annotated prior to
    // running the command.
    auto info = node->getFileInfo(system.getFileSystem());

    // If this output is mutated by the build, we can't rely on equivalence,
    // only existence.
    if (node->isMutated()) {
      if (value.getNthOutputInfo(i).isMissing() != info.isMissing())
        return false;
      continue;
    }

    if (value.getNthOutputInfo(i) != info)
      return false;
  }

  // Otherwise, the result is ok.
  return true;
}